

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86.cpp
# Opt level: O0

int __thiscall ncnn::GELU_x86::forward_inplace(GELU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  long lVar2;
  int iVar3;
  long *in_RSI;
  Option *in_RDI;
  float fVar4;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  v4sf afVar5;
  __m128 _blob;
  __m128 _cube;
  __m128 _pLoad;
  __m128 _fast2c128;
  __m128 _fast1c128;
  __m128 _one128;
  __m128 _half128;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int elempack;
  int h;
  int w;
  Mat *m;
  undefined8 local_368;
  undefined8 uStackY_360;
  int local_2f8;
  float *local_2a0;
  int local_298;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  
  if (*(int *)((long)&in_RDI[3].workspace_allocator + *(long *)(*(long *)in_RDI + -0x18)) == 0) {
    iVar3 = GELU::forward_inplace
                      ((GELU *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                       (Mat *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),in_RDI);
  }
  else {
    lVar2 = in_RSI[7];
    iVar3 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * (int)in_RSI[3];
    for (local_298 = 0; local_298 < (int)lVar2; local_298 = local_298 + 1) {
      local_2a0 = (float *)(*in_RSI + in_RSI[8] * (long)local_298 * in_RSI[2]);
      for (local_2f8 = 0; local_2f8 + 3 < iVar3; local_2f8 = local_2f8 + 4) {
        local_f8 = (float)*(undefined8 *)local_2a0;
        fStack_f4 = (float)((ulong)*(undefined8 *)local_2a0 >> 0x20);
        fStack_f0 = (float)*(undefined8 *)(local_2a0 + 2);
        fStack_ec = (float)((ulong)*(undefined8 *)(local_2a0 + 2) >> 0x20);
        afVar5[2] = 0.7978845;
        afVar5[3] = 0.7978845;
        afVar5[0] = (local_f8 + local_f8 * local_f8 * local_f8 * 0.044715) * 0.7978845;
        afVar5[1] = (fStack_f4 + fStack_f4 * fStack_f4 * fStack_f4 * 0.044715) * 0.7978845;
        afVar5 = tanh_ps(afVar5);
        local_e8 = afVar5[0];
        fStack_e4 = afVar5[1];
        local_368 = CONCAT44((fStack_e4 + 1.0) * fStack_f4 * 0.5,(local_e8 + 1.0) * local_f8 * 0.5);
        uStackY_360._0_4_ = (extraout_XMM0_Dc + 1.0) * fStack_f0 * 0.5;
        uStackY_360._4_4_ = (extraout_XMM0_Dd + 1.0) * fStack_ec * 0.5;
        *(undefined8 *)local_2a0 = local_368;
        *(undefined8 *)(local_2a0 + 2) = uStackY_360;
        local_2a0 = local_2a0 + 4;
      }
      for (; local_2f8 < iVar3; local_2f8 = local_2f8 + 1) {
        fVar1 = *local_2a0;
        fVar4 = tanhf((*local_2a0 + *local_2a0 * 0.044715 * *local_2a0 * *local_2a0) * 0.7978845);
        *local_2a0 = fVar1 * 0.5 * (fVar4 + 1.0);
        local_2a0 = local_2a0 + 1;
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int GELU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}